

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvarianceTestInstance::iterate
          (TestStatus *__return_storage_ptr__,InvarianceTestInstance *this)

{
  undefined8 *puVar1;
  int count;
  iterator __position;
  pointer pPVar2;
  undefined8 *puVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  int aiVar5 [2];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  deInt32 dVar13;
  _Alloc_hider obj;
  VkRenderPass renderPass;
  Handle<(vk::HandleType)21> commandBuffer;
  Allocation *pAVar14;
  deUint32 queueFamilyIndex;
  int iVar15;
  PerPrimitive *__cur;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  TextureFormat format;
  undefined4 extraout_var;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  ulong uVar16;
  GraphicsPipelineBuilder *pGVar17;
  const_iterator cVar18;
  ostream *poVar19;
  pointer this_03;
  PerPrimitive *pPVar20;
  pointer pPVar21;
  TessPrimitiveType TVar22;
  _func_bool_PerPrimitive_ptr_PerPrimitive_ptr *pred;
  ulong uVar23;
  vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *unsorted;
  Vec4 *pVVar24;
  int iVar25;
  ulong bufferSize;
  char *pcVar26;
  MessageBuilder *__n;
  PerPrimitive *primitivesA;
  ulong uVar27;
  undefined1 *puVar28;
  _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
  *this_04;
  _Vector_impl_data *p_Var29;
  Handle<(vk::HandleType)21> HVar30;
  int stride;
  pointer pTVar31;
  Vec4 *pVVar32;
  int i;
  long lVar33;
  long lVar34;
  pointer pLVar35;
  pointer pWVar36;
  long lVar37;
  pointer pPVar38;
  long lVar39;
  bool bVar40;
  string local_678;
  PerPrimitiveVec prim0;
  PerPrimitiveVec firstPrim;
  long local_610;
  PerPrimitiveVec primitives;
  char *local_5e8;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5c8;
  string *psStack_5c0;
  long local_5b8;
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  tessLevelCases;
  pointer local_598;
  pointer pWStack_590;
  pointer local_588;
  VkAllocationCallbacks *pVStack_580;
  pointer local_578;
  pointer local_570;
  VkAllocationCallbacks *local_568;
  pointer local_560;
  int primitiveCount;
  undefined4 uStack_554;
  pointer pWStack_550;
  pointer local_548;
  VkDescriptorPool VStack_540;
  pointer local_538;
  pointer pVStack_530;
  pointer local_528;
  pointer local_518;
  ios_base local_4e8 [8];
  ios_base local_4e0 [272];
  long *local_3d0;
  long local_3c8;
  long local_3c0 [2];
  vector<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_> windingCases;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  primitiveCounts;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_370;
  string local_358;
  Buffer local_338;
  VkPipelineLayout local_308;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_300;
  VkDescriptorSetLayout local_2e8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_2e0;
  long local_2c0;
  VkQueue local_2b8;
  undefined8 local_2b0;
  Buffer local_2a8;
  VkCommandPool local_278;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_270;
  VkFramebuffer local_258;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_250;
  VkDescriptorPool local_238;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_230;
  key_type local_210;
  string local_1f0;
  VkDescriptorBufferInfo resultBufferInfo;
  ostringstream tessLevelsStr;
  Handle<(vk::HandleType)14> HStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_148 [8];
  ios_base local_140 [132];
  deUint32 local_bc;
  bool local_b8;
  VkPrimitiveTopology local_b4;
  
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,0xb);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_2b8 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(&tessLevelCases,this);
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  primitiveCounts.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)((ulong)((long)tessLevelCases.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)tessLevelCases.
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
    iVar25 = 0;
  }
  else {
    lVar39 = 0;
    iVar25 = 0;
    do {
      _primitiveCount = 0;
      pWStack_550 = (pointer)0x0;
      local_548 = (pointer)0x0;
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&primitiveCounts,(vector<int,_std::allocator<int>_> *)&primitiveCount);
      if ((pointer)_primitiveCount != (pointer)0x0) {
        operator_delete((void *)_primitiveCount,(long)local_548 - _primitiveCount);
      }
      pTVar31 = tessLevelCases.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar39].levels.
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)tessLevelCases.
                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar39].levels.
                                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar31) >> 3)
              * -0x55555555) {
        lVar34 = 8;
        lVar37 = 0;
        do {
          iVar15 = referencePrimitiveCount
                             ((this->m_caseDef).primitiveType,(this->m_caseDef).spacingMode,
                              (this->m_caseDef).usePointMode,
                              (float *)((long)pTVar31->inner + lVar34 + -8),
                              (float *)((long)pTVar31->inner + lVar34));
          primitiveCount = iVar15;
          __position._M_current =
               primitiveCounts.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
          if (__position._M_current ==
              primitiveCounts.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)
                       (primitiveCounts.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),__position,&primitiveCount)
            ;
          }
          else {
            *__position._M_current = iVar15;
            primitiveCounts.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
                 = __position._M_current + 1;
          }
          iVar15 = primitiveCount;
          if (primitiveCount < iVar25) {
            iVar15 = iVar25;
          }
          iVar25 = iVar15;
          lVar37 = lVar37 + 1;
          pTVar31 = tessLevelCases.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar39].levels.
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar34 = lVar34 + 0x18;
        } while (lVar37 < (int)((ulong)((long)tessLevelCases.
                                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                              ._M_impl.super__Vector_impl_data._M_start[lVar39].
                                              levels.
                                              super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pTVar31) >> 3) * -0x55555555);
      }
      lVar39 = lVar39 + 1;
    } while (lVar39 < (int)((ulong)((long)tessLevelCases.
                                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)tessLevelCases.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 5));
    iVar25 = iVar25 * 2;
  }
  format = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  iVar15 = tcu::getPixelSize(format);
  local_2b0 = CONCAT44(extraout_var,iVar15);
  makeBufferCreateInfo((VkBufferCreateInfo *)&primitiveCount,(ulong)(uint)(iVar15 * 0xc),0x80);
  tessellation::Buffer::Buffer
            (&local_2a8,vk,device,allocator,(VkBufferCreateInfo *)&primitiveCount,
             (MemoryRequirement)0x1);
  iVar15 = numVerticesPerPrimitive((this->m_caseDef).primitiveType,(this->m_caseDef).usePointMode);
  bufferSize = (long)(iVar25 * iVar15) << 6 | 0x10;
  makeBufferCreateInfo((VkBufferCreateInfo *)&primitiveCount,bufferSize,0x20);
  tessellation::Buffer::Buffer
            (&local_338,vk,device,allocator,(VkBufferCreateInfo *)&primitiveCount,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&primitiveCount);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&primitiveCount,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,8,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&tessLevelsStr,this_00,vk,device,0);
  DStack_2e0.m_device = (VkDevice)local_1a8[0]._0_8_;
  DStack_2e0.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
  local_2e8.m_internal = (deUint64)_tessLevelsStr;
  DStack_2e0.m_deviceIface = (DeviceInterface *)HStack_1b0.m_internal;
  _tessLevelsStr = (pointer)0x0;
  HStack_1b0.m_internal = 0;
  local_1a8[0]._M_allocated_capacity = (DeviceInterface *)0x0;
  local_1a8[0]._8_8_ = (VkDevice)0x0;
  if (local_528 != (pointer)0x0) {
    operator_delete(local_528,(long)local_518 - (long)local_528);
  }
  if ((VkAllocationCallbacks *)VStack_540.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_540.m_internal,(long)pVStack_530 - VStack_540.m_internal);
  }
  if ((pointer)_primitiveCount != (pointer)0x0) {
    operator_delete((void *)_primitiveCount,(long)local_548 - _primitiveCount);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&tessLevelsStr);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&tessLevelsStr,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&primitiveCount,this_01,vk,device,1,1);
  DStack_230.m_device = (VkDevice)local_548;
  DStack_230.m_allocator = (VkAllocationCallbacks *)VStack_540.m_internal;
  local_238.m_internal = _primitiveCount;
  DStack_230.m_deviceIface = (DeviceInterface *)pWStack_550;
  _primitiveCount = 0;
  pWStack_550 = (pointer)0x0;
  local_548 = (pointer)0x0;
  VStack_540.m_internal = 0;
  if ((int  [2])_tessLevelsStr != (int  [2])0x0) {
    operator_delete(_tessLevelsStr,local_1a8[0]._M_allocated_capacity - (long)_tessLevelsStr);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&primitiveCount,vk,device,local_238,
                    local_2e8);
  local_588 = local_548;
  pVStack_580 = (VkAllocationCallbacks *)VStack_540.m_internal;
  local_598 = (pointer)_primitiveCount;
  pWStack_590 = pWStack_550;
  resultBufferInfo.buffer.m_internal =
       local_338.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&primitiveCount);
  this_02 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&primitiveCount,(int)local_598,(void *)0x0,0);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  if (local_528 != (pointer)0x0) {
    operator_delete(local_528,(long)local_518 - (long)local_528);
  }
  if ((VkAllocationCallbacks *)VStack_540.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_540.m_internal,(long)pVStack_530 - VStack_540.m_internal);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&primitiveCount);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&primitiveCount,vk,device);
  renderPass.m_internal = _primitiveCount;
  DStack_370.m_device = (VkDevice)local_548;
  DStack_370.m_allocator = (VkAllocationCallbacks *)VStack_540.m_internal;
  DStack_370.m_deviceIface = (DeviceInterface *)pWStack_550;
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&primitiveCount,vk,device,
             (VkRenderPass)_primitiveCount);
  DStack_250.m_device = (VkDevice)local_548;
  DStack_250.m_allocator = (VkAllocationCallbacks *)VStack_540.m_internal;
  local_258.m_internal = _primitiveCount;
  DStack_250.m_deviceIface = (DeviceInterface *)pWStack_550;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&primitiveCount,vk,device,local_2e8);
  DStack_300.m_device = (VkDevice)local_548;
  DStack_300.m_allocator = (VkAllocationCallbacks *)VStack_540.m_internal;
  local_308.m_internal = _primitiveCount;
  DStack_300.m_deviceIface = (DeviceInterface *)pWStack_550;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&primitiveCount,vk,device,
                  queueFamilyIndex);
  DStack_270.m_device = (VkDevice)local_548;
  DStack_270.m_allocator = (VkAllocationCallbacks *)VStack_540.m_internal;
  local_278.m_internal = _primitiveCount;
  DStack_270.m_deviceIface = (DeviceInterface *)pWStack_550;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&primitiveCount,vk,device,
             (VkCommandPool)_primitiveCount,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  commandBuffer.m_internal = _primitiveCount;
  local_578 = pWStack_550;
  local_570 = local_548;
  local_568 = (VkAllocationCallbacks *)VStack_540.m_internal;
  if (0 < (int)((ulong)((long)tessLevelCases.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)tessLevelCases.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
    psStack_5c0 = (string *)&__return_storage_ptr__->m_description;
    local_5c8 = &(__return_storage_ptr__->m_description).field_2;
    local_610 = 0;
    do {
      pLVar35 = tessLevelCases.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                ._M_impl.super__Vector_impl_data._M_start;
      firstPrim.
      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      firstPrim.
      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      firstPrim.
      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pPVar2 = (pointer)((this->super_TestInstance).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessLevelsStr);
      local_2c0 = local_610 * 0x20;
      pLVar35 = pLVar35 + local_610;
      lVar39 = -0x5555555555555555;
      uVar16 = ((long)(pLVar35->levels).
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pLVar35->levels).
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      if (0 < (int)uVar16) {
        lVar37 = 0;
        lVar34 = 0;
        do {
          TVar22 = (TessPrimitiveType)lVar39;
          pcVar26 = "";
          if (1 < uVar16) {
            pcVar26 = "\n";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&tessLevelsStr,pcVar26,(ulong)(1 < uVar16));
          getTessellationLevelsString_abi_cxx11_
                    ((string *)&primitiveCount,
                     (tessellation *)
                     ((long)((pLVar35->levels).
                             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                             ._M_impl.super__Vector_impl_data._M_start)->inner + lVar37),
                     (TessLevels *)(ulong)(this->m_caseDef).primitiveType,TVar22);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&tessLevelsStr,(char *)_primitiveCount,(long)pWStack_550);
          if ((pointer)_primitiveCount != (pointer)&local_548) {
            operator_delete((void *)_primitiveCount,
                            (ulong)((long)&(local_548->imageInfos).
                                           super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          lVar34 = lVar34 + 1;
          uVar16 = ((long)(pLVar35->levels).
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pLVar35->levels).
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          lVar39 = (long)(int)uVar16;
          lVar37 = lVar37 + 0x18;
        } while (lVar34 < lVar39);
      }
      _primitiveCount = (deUint64)pPVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_550);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pWStack_550,"Tessellation level sets: ",0x19);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pWStack_550,local_5e8,(long)DStack_5e0.m_deviceIface);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&primitiveCount,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if ((VkDevice *)local_5e8 != &DStack_5e0.m_device) {
        operator_delete(local_5e8,(ulong)(DStack_5e0.m_device + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_550);
      std::ios_base::~ios_base(local_4e0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessLevelsStr);
      std::ios_base::~ios_base(local_148);
      pTVar31 = (pLVar35->levels).
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(pLVar35->levels).
                                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar31) >> 3)
              * -0x55555555) {
        lVar39 = 0;
        do {
          local_548 = *(pointer *)(pTVar31[lVar39].outer + 2);
          _primitiveCount = *(deUint64 *)pTVar31[lVar39].inner;
          pWStack_550 = *(pointer *)pTVar31[lVar39].outer;
          pVStack_530 = *(pointer *)(pTVar31[lVar39].outer + 2);
          VStack_540.m_internal = *(deUint64 *)pTVar31[lVar39].inner;
          local_538 = *(pointer *)pTVar31[lVar39].outer;
          puVar3 = (undefined8 *)
                   (local_2a8.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->m_hostPtr;
          puVar3[4] = local_538;
          puVar3[5] = pVStack_530;
          puVar3[2] = local_548;
          puVar3[3] = VStack_540.m_internal;
          *puVar3 = _primitiveCount;
          puVar3[1] = pWStack_550;
          local_5b8 = lVar39;
          ::vk::flushMappedMemoryRange
                    (vk,device,
                     (VkDeviceMemory)
                     ((local_2a8.m_allocation.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal,
                     (local_2a8.m_allocation.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     ptr)->m_offset,0x30);
          getWindingCases(&windingCases,(this->m_caseDef).windingUsage);
          if (windingCases.
              super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              windingCases.
              super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            iVar25 = 0;
            bVar40 = true;
          }
          else {
            local_560 = pTVar31 + lVar39;
            iVar25 = 0;
            pWVar36 = windingCases.
                      super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              memset((GraphicsPipelineBuilder *)&tessLevelsStr,0,0xfc);
              local_b8 = false;
              local_b4 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
              local_bc = 6;
              pGVar17 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                                  ((GraphicsPipelineBuilder *)&tessLevelsStr,VK_FORMAT_R32_SFLOAT,
                                   (deUint32)local_2b0);
              p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                        *)((this->super_TestInstance).m_context)->m_progCollection;
              primitives.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&primitives.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char_const*>((string *)&primitives,"vert","");
              cVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       ::find(p_Var4,(key_type *)&primitives);
              pGVar17 = GraphicsPipelineBuilder::setShader
                                  (pGVar17,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                                   *(ProgramBinary **)(cVar18._M_node + 2),
                                   (VkSpecializationInfo *)0x0);
              p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                        *)((this->super_TestInstance).m_context)->m_progCollection;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)&prim0.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char_const*>((string *)&prim0,"tesc","");
              cVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       ::find(p_Var4,(key_type *)&prim0);
              pGVar17 = GraphicsPipelineBuilder::setShader
                                  (pGVar17,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                                   *(ProgramBinary **)(cVar18._M_node + 2),
                                   (VkSpecializationInfo *)0x0);
              p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                        *)((this->super_TestInstance).m_context)->m_progCollection;
              local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"tese","");
              getProgramName(&local_1f0,&local_358,*pWVar36,(this->m_caseDef).usePointMode);
              cVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       ::find(p_Var4,&local_1f0);
              pGVar17 = GraphicsPipelineBuilder::setShader
                                  (pGVar17,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                                   *(ProgramBinary **)(cVar18._M_node + 2),
                                   (VkSpecializationInfo *)0x0);
              p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                        *)((this->super_TestInstance).m_context)->m_progCollection;
              local_3d0 = local_3c0;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"geom","");
              bVar40 = (this->m_caseDef).usePointMode;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&primitiveCount);
              poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&primitiveCount,(char *)local_3d0,local_3c8);
              bVar40 = bVar40 != false;
              pcVar26 = "";
              if (bVar40) {
                pcVar26 = "_point_mode";
              }
              lVar39 = 0;
              if (bVar40) {
                lVar39 = 0xb;
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,pcVar26,lVar39);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&primitiveCount);
              std::ios_base::~ios_base(local_4e8);
              cVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                       ::find(p_Var4,&local_210);
              pGVar17 = GraphicsPipelineBuilder::setShader
                                  (pGVar17,vk,device,VK_SHADER_STAGE_GEOMETRY_BIT,
                                   *(ProgramBinary **)(cVar18._M_node + 2),
                                   (VkSpecializationInfo *)0x0);
              GraphicsPipelineBuilder::build
                        ((Move<vk::Handle<(vk::HandleType)18>_> *)&local_678,pGVar17,vk,device,
                         local_308,renderPass);
              obj._M_p = local_678._M_dataplus._M_p;
              DStack_5e0.m_device = (VkDevice)local_678.field_2._M_allocated_capacity;
              DStack_5e0.m_allocator = (VkAllocationCallbacks *)local_678.field_2._8_8_;
              local_5e8 = local_678._M_dataplus._M_p;
              DStack_5e0.m_deviceIface = (DeviceInterface *)local_678._M_string_length;
              local_678._M_dataplus._M_p = (char *)0x0;
              local_678._M_string_length = 0;
              local_678.field_2._M_allocated_capacity = 0;
              local_678.field_2._8_8_ = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != &local_210.field_2) {
                operator_delete(local_210._M_dataplus._M_p,
                                local_210.field_2._M_allocated_capacity + 1);
              }
              if (local_3d0 != local_3c0) {
                operator_delete(local_3d0,local_3c0[0] + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_dataplus._M_p != &local_358.field_2) {
                operator_delete(local_358._M_dataplus._M_p,
                                local_358.field_2._M_allocated_capacity + 1);
              }
              if (prim0.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&prim0.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(prim0.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&(prim0.
                                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->patchPrimitiveID + 1));
              }
              if (primitives.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&primitives.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(primitives.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (ulong)((long)&(primitives.
                                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->patchPrimitiveID + 1));
              }
              GraphicsPipelineBuilder::~GraphicsPipelineBuilder
                        ((GraphicsPipelineBuilder *)&tessLevelsStr);
              pAVar14 = local_338.m_allocation.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .ptr;
              memset((local_338.m_allocation.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     ptr)->m_hostPtr,0,bufferSize);
              ::vk::flushMappedMemoryRange
                        (vk,device,(VkDeviceMemory)(pAVar14->m_memory).m_internal,pAVar14->m_offset,
                         bufferSize);
              beginCommandBuffer(vk,(VkCommandBuffer)commandBuffer.m_internal);
              beginRenderPassWithRasterizationDisabled
                        (vk,(VkCommandBuffer)commandBuffer.m_internal,renderPass,local_258);
              (*vk->_vptr_DeviceInterface[0x4c])(vk,commandBuffer.m_internal,0,obj._M_p);
              (*vk->_vptr_DeviceInterface[0x56])
                        (vk,commandBuffer.m_internal,0,local_308.m_internal,0,1,&local_598,0,0);
              _primitiveCount = 0;
              (*vk->_vptr_DeviceInterface[0x58])
                        (vk,commandBuffer.m_internal,0,1,&local_2a8,
                         (MessageBuilder *)&primitiveCount);
              (*vk->_vptr_DeviceInterface[0x59])(vk,commandBuffer.m_internal,0xc,1,0,0);
              endRenderPass(vk,(VkCommandBuffer)commandBuffer.m_internal);
              makeBufferMemoryBarrier
                        ((VkBufferMemoryBarrier *)&primitiveCount,0x40,0x2000,
                         (VkBuffer)
                         local_338.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                         object.m_internal,0,bufferSize);
              (*vk->_vptr_DeviceInterface[0x6d])
                        (vk,commandBuffer.m_internal,0x8000,0x4000,0,0,0,1,
                         (MessageBuilder *)&primitiveCount,0,0);
              endCommandBuffer(vk,(VkCommandBuffer)commandBuffer.m_internal);
              submitCommandsAndWait(vk,device,local_2b8,(VkCommandBuffer)commandBuffer.m_internal);
              pAVar14 = local_338.m_allocation.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .ptr;
              uVar16 = bufferSize;
              ::vk::invalidateMappedMemoryRange
                        (vk,device,
                         (VkDeviceMemory)
                         ((local_338.m_allocation.
                           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                           m_data.ptr)->m_memory).m_internal,
                         (local_338.m_allocation.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.ptr)->m_offset,bufferSize);
              stride = (int)uVar16;
              iVar15 = primitiveCounts.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_610].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[local_5b8];
              numVerticesPerPrimitive
                        ((this->m_caseDef).primitiveType,(this->m_caseDef).usePointMode);
              count = *pAVar14->m_hostPtr;
              pred = (_func_bool_PerPrimitive_ptr_PerPrimitive_ptr *)&DAT_00000010;
              readInterleavedData<vkt::tessellation::(anonymous_namespace)::PerPrimitive>
                        ((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          *)&primitiveCount,count,pAVar14->m_hostPtr,0x10,stride);
              __n = (MessageBuilder *)&primitiveCount;
              sorted<vkt::tessellation::(anonymous_namespace)::PerPrimitive,bool(*)(vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&,vkt::tessellation::(anonymous_namespace)::PerPrimitive_const&)>
                        (&primitives,(tessellation *)&primitiveCount,unsorted,pred);
              if ((pointer)_primitiveCount != (pointer)0x0) {
                __n = (MessageBuilder *)((long)local_548 - _primitiveCount);
                operator_delete((void *)_primitiveCount,(ulong)__n);
              }
              pPVar2 = primitives.
                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              iVar15 = iVar15 * 2;
              aiVar5 = (int  [2])((this->super_TestInstance).m_context)->m_testCtx->m_log;
              if (count != iVar15) {
                _primitiveCount = (deUint64)aiVar5;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_550);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pWStack_550,"Failure: got ",0xd);
                std::ostream::operator<<((ostringstream *)&pWStack_550,count);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pWStack_550," primitives, but expected ",0x1a);
                std::ostream::operator<<((ostringstream *)&pWStack_550,iVar15);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&primitiveCount,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_550);
                std::ios_base::~ios_base(local_4e0);
                _primitiveCount = (deUint64)&local_548;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&primitiveCount,"Invalid set of primitives","");
                __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_5c8;
                std::__cxx11::string::_M_construct<char*>
                          (psStack_5c0,_primitiveCount,
                           (long)&(pWStack_550->imageInfos).
                                  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start + _primitiveCount);
                if ((pointer)_primitiveCount != (pointer)&local_548) {
                  puVar28 = (undefined1 *)
                            ((long)&(local_548->imageInfos).
                                    super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1);
                  HVar30.m_internal = _primitiveCount;
LAB_00774d85:
                  operator_delete((void *)HVar30.m_internal,(ulong)puVar28);
                }
LAB_00774d8a:
                if (primitives.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(primitives.
                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)primitives.
                                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)primitives.
                                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (obj._M_p != (pointer)0x0) {
                  ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                            (&DStack_5e0,(VkPipeline)obj._M_p);
                }
                iVar25 = 1;
                bVar40 = false;
                goto LAB_00774dd1;
              }
              uVar16 = (ulong)((long)primitives.
                                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)primitives.
                                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 6) >> 1;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if ((ulong)(long)(int)uVar16 >> 0x39 != 0) {
                std::__throw_length_error("cannot create std::vector larger than max_size()");
              }
              this_03 = std::
                        _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ::_M_allocate((_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                       *)(long)(int)uVar16,(size_t)__n);
              lVar39 = (long)(uVar16 << 0x20) >> 0x1a;
              primitivesA = (PerPrimitive *)((long)pPVar2->unused_padding + lVar39 + -8);
              pPVar21 = (pointer)((long)this_03->unused_padding + lVar39 + -8);
              pPVar20 = pPVar2;
              pPVar38 = this_03;
              if (uVar16 << 0x20 != 0) {
                do {
                  dVar13 = pPVar20->primitiveID;
                  uVar6 = *(undefined8 *)pPVar20->unused_padding;
                  pPVar38->patchPrimitiveID = pPVar20->patchPrimitiveID;
                  pPVar38->primitiveID = dVar13;
                  *(undefined8 *)pPVar38->unused_padding = uVar6;
                  uVar6 = *(undefined8 *)(pPVar20->tessCoord[0].m_data + 2);
                  uVar7 = *(undefined8 *)pPVar20->tessCoord[1].m_data;
                  uVar8 = *(undefined8 *)(pPVar20->tessCoord[1].m_data + 2);
                  uVar9 = *(undefined8 *)pPVar20->tessCoord[2].m_data;
                  uVar10 = *(undefined8 *)(pPVar20->tessCoord[2].m_data + 2);
                  *(undefined8 *)pPVar38->tessCoord[0].m_data =
                       *(undefined8 *)pPVar20->tessCoord[0].m_data;
                  *(undefined8 *)(pPVar38->tessCoord[0].m_data + 2) = uVar6;
                  *(undefined8 *)pPVar38->tessCoord[1].m_data = uVar7;
                  *(undefined8 *)(pPVar38->tessCoord[1].m_data + 2) = uVar8;
                  *(undefined8 *)pPVar38->tessCoord[2].m_data = uVar9;
                  *(undefined8 *)(pPVar38->tessCoord[2].m_data + 2) = uVar10;
                  pPVar20 = pPVar20 + 1;
                  pPVar38 = pPVar38 + 1;
                } while (pPVar20 != primitivesA);
              }
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_start = this_03;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_finish = pPVar38;
              prim0.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar21;
              bVar40 = comparePrimitivesExact
                                 ((PrimitiveSetInvariance *)this_03,primitivesA,
                                  (PerPrimitive *)(uVar16 & 0xffffffff),(int)pPVar21);
              TVar22 = (TessPrimitiveType)pPVar21;
              if (!bVar40) {
                _tessLevelsStr = (pointer)aiVar5;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&HStack_1b0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&HStack_1b0,
                           "Failure: tessellation coordinates differ between two primitives drawn in one draw call"
                           ,0x56);
                _primitiveCount =
                     (deUint64)
                     tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)&tessLevelsStr,
                                (EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_550);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pWStack_550,
                           "Note: tessellation levels for both primitives were: ",0x34);
                getTessellationLevelsString_abi_cxx11_
                          (&local_678,(tessellation *)local_560,
                           (TessLevels *)(ulong)(this->m_caseDef).primitiveType,TVar22);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&pWStack_550,local_678._M_dataplus._M_p,
                           local_678._M_string_length);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&primitiveCount,
                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_678._M_dataplus._M_p != &local_678.field_2) {
                  operator_delete(local_678._M_dataplus._M_p,
                                  local_678.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_550);
                std::ios_base::~ios_base(local_4e0);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&HStack_1b0);
                std::ios_base::~ios_base(local_140);
                _primitiveCount = (deUint64)&local_548;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&primitiveCount,"Invalid set of primitives","");
                __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_5c8;
                std::__cxx11::string::_M_construct<char*>
                          (psStack_5c0,_primitiveCount,
                           (long)&(pWStack_550->imageInfos).
                                  super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start + _primitiveCount);
LAB_00774d4e:
                if ((pointer)_primitiveCount != (pointer)&local_548) {
                  operator_delete((void *)_primitiveCount,
                                  (ulong)((long)&(local_548->imageInfos).
                                                 super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 1));
                }
                if (prim0.
                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  puVar28 = (undefined1 *)
                            ((long)prim0.
                                   super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)prim0.
                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                  HVar30.m_internal =
                       (deUint64)
                       prim0.
                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  goto LAB_00774d85;
                }
                goto LAB_00774d8a;
              }
              if (iVar25 == 0 && (int)local_5b8 == 0) {
                uVar16 = (long)pPVar38 - (long)this_03;
                this_04 = (_Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                           *)((long)uVar16 >> 6);
                if ((ulong)((long)firstPrim.
                                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                           (long)firstPrim.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_start) < uVar16) {
                  pPVar21 = std::
                            _Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ::_M_allocate(this_04,(size_t)primitivesA);
                  if (this_03 != pPVar38) {
                    lVar39 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)this_03->unused_padding + lVar39 + -8);
                      uVar6 = puVar3[1];
                      puVar1 = (undefined8 *)((long)pPVar21->unused_padding + lVar39 + -8);
                      *puVar1 = *puVar3;
                      puVar1[1] = uVar6;
                      puVar3 = (undefined8 *)((long)this_03->tessCoord[0].m_data + lVar39);
                      uVar6 = puVar3[1];
                      puVar1 = (undefined8 *)((long)this_03->tessCoord[1].m_data + lVar39);
                      uVar7 = *puVar1;
                      uVar8 = puVar1[1];
                      puVar1 = (undefined8 *)((long)this_03->tessCoord[2].m_data + lVar39);
                      uVar9 = *puVar1;
                      uVar10 = puVar1[1];
                      puVar1 = (undefined8 *)((long)pPVar21->tessCoord[0].m_data + lVar39);
                      *puVar1 = *puVar3;
                      puVar1[1] = uVar6;
                      puVar3 = (undefined8 *)((long)pPVar21->tessCoord[1].m_data + lVar39);
                      *puVar3 = uVar7;
                      puVar3[1] = uVar8;
                      puVar3 = (undefined8 *)((long)pPVar21->tessCoord[2].m_data + lVar39);
                      *puVar3 = uVar9;
                      puVar3[1] = uVar10;
                      lVar34 = lVar39 + -8;
                      lVar39 = lVar39 + 0x40;
                    } while ((pointer)((long)this_03[1].unused_padding + lVar34) != pPVar38);
                  }
                  if (firstPrim.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(firstPrim.
                                    super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)firstPrim.
                                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)firstPrim.
                                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  firstPrim.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((long)pPVar21 + uVar16);
                  firstPrim.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_start = pPVar21;
                }
                else {
                  uVar27 = (long)firstPrim.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)firstPrim.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  if (uVar27 < uVar16) {
                    if (0 < (long)uVar27 >> 6) {
                      uVar23 = ((long)uVar27 >> 6) + 1;
                      lVar39 = 0;
                      do {
                        puVar3 = (undefined8 *)((long)this_03->unused_padding + lVar39 + -8);
                        uVar6 = *puVar3;
                        uVar7 = puVar3[1];
                        puVar3 = (undefined8 *)((long)this_03->tessCoord[0].m_data + lVar39);
                        uVar8 = *puVar3;
                        uVar9 = puVar3[1];
                        puVar3 = (undefined8 *)((long)this_03->tessCoord[1].m_data + lVar39);
                        uVar10 = *puVar3;
                        uVar11 = puVar3[1];
                        puVar3 = (undefined8 *)((long)this_03->tessCoord[2].m_data + lVar39);
                        uVar12 = puVar3[1];
                        puVar1 = (undefined8 *)
                                 ((long)(firstPrim.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->tessCoord[2].
                                        m_data + lVar39);
                        *puVar1 = *puVar3;
                        puVar1[1] = uVar12;
                        puVar3 = (undefined8 *)
                                 ((long)(firstPrim.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->tessCoord[1].
                                        m_data + lVar39);
                        *puVar3 = uVar10;
                        puVar3[1] = uVar11;
                        puVar3 = (undefined8 *)
                                 ((long)(firstPrim.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->tessCoord[0].
                                        m_data + lVar39);
                        *puVar3 = uVar8;
                        puVar3[1] = uVar9;
                        puVar3 = (undefined8 *)
                                 ((long)(firstPrim.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->unused_padding
                                 + lVar39 + -8);
                        *puVar3 = uVar6;
                        puVar3[1] = uVar7;
                        uVar23 = uVar23 - 1;
                        lVar39 = lVar39 + 0x40;
                      } while (1 < uVar23);
                    }
                    pPVar21 = (pointer)((long)this_03 + uVar27);
                    if (pPVar21 != pPVar38) {
                      pVVar24 = (firstPrim.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->tessCoord;
                      lVar39 = (long)this_03 + uVar27 + 0x10;
                      do {
                        dVar13 = pPVar21->primitiveID;
                        uVar6 = *(undefined8 *)pPVar21->unused_padding;
                        (firstPrim.
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->patchPrimitiveID =
                             pPVar21->patchPrimitiveID;
                        (firstPrim.
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->primitiveID = dVar13;
                        *(undefined8 *)
                         (firstPrim.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->unused_padding = uVar6;
                        lVar37 = 0;
                        lVar34 = lVar39;
                        pVVar32 = pVVar24;
                        do {
                          lVar33 = 0;
                          do {
                            pVVar32->m_data[lVar33] = *(float *)(lVar34 + lVar33 * 4);
                            lVar33 = lVar33 + 1;
                          } while (lVar33 != 4);
                          lVar37 = lVar37 + 1;
                          pVVar32 = pVVar32 + 1;
                          lVar34 = lVar34 + 0x10;
                        } while (lVar37 != 3);
                        pPVar21 = pPVar21 + 1;
                        firstPrim.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             firstPrim.
                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1;
                        pVVar24 = pVVar24 + 4;
                        lVar39 = lVar39 + 0x40;
                      } while (pPVar21 != pPVar38);
                    }
                  }
                  else if (0 < (long)this_04) {
                    p_Var29 = (_Vector_impl_data *)
                              ((long)&(this_04->_M_impl).super__Vector_impl_data._M_start + 1);
                    lVar39 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)this_03->unused_padding + lVar39 + -8);
                      uVar6 = *puVar3;
                      uVar7 = puVar3[1];
                      puVar3 = (undefined8 *)((long)this_03->tessCoord[0].m_data + lVar39);
                      uVar8 = *puVar3;
                      uVar9 = puVar3[1];
                      puVar3 = (undefined8 *)((long)this_03->tessCoord[1].m_data + lVar39);
                      uVar10 = *puVar3;
                      uVar11 = puVar3[1];
                      puVar3 = (undefined8 *)((long)this_03->tessCoord[2].m_data + lVar39);
                      uVar12 = puVar3[1];
                      puVar1 = (undefined8 *)
                               ((long)(firstPrim.
                                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->tessCoord[2].
                                      m_data + lVar39);
                      *puVar1 = *puVar3;
                      puVar1[1] = uVar12;
                      puVar3 = (undefined8 *)
                               ((long)(firstPrim.
                                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->tessCoord[1].
                                      m_data + lVar39);
                      *puVar3 = uVar10;
                      puVar3[1] = uVar11;
                      puVar3 = (undefined8 *)
                               ((long)(firstPrim.
                                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->tessCoord[0].
                                      m_data + lVar39);
                      *puVar3 = uVar8;
                      puVar3[1] = uVar9;
                      puVar3 = (undefined8 *)
                               ((long)(firstPrim.
                                       super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->unused_padding +
                               lVar39 + -8);
                      *puVar3 = uVar6;
                      puVar3[1] = uVar7;
                      p_Var29 = (_Vector_impl_data *)
                                ((long)&p_Var29[0xffffffffffffffff]._M_end_of_storage + 7);
                      lVar39 = lVar39 + 0x40;
                    } while ((_Vector_impl_data *)&DAT_00000001 < p_Var29);
                  }
                }
                firstPrim.
                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((long)firstPrim.
                                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar16);
              }
              else {
                iVar15 = (*(this->super_TestInstance)._vptr_TestInstance[4])
                                   (this,&firstPrim,&prim0,(ulong)(uint)pLVar35->mem);
                if ((char)iVar15 == '\0') {
                  _primitiveCount = (deUint64)aiVar5;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pWStack_550);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_550,
                             "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
                             ,0x62);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_550,"  - case A: program 0, tessellation levels: ",
                             0x2c);
                  lVar39 = local_2c0;
                  getTessellationLevelsString_abi_cxx11_
                            ((string *)&tessLevelsStr,
                             *(tessellation **)
                              ((long)&((tessLevelCases.
                                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->levels).
                                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                      ._M_impl.super__Vector_impl_data._M_start + local_2c0),
                             (TessLevels *)(ulong)(this->m_caseDef).primitiveType,
                             (TessPrimitiveType)local_2c0);
                  TVar22 = (TessPrimitiveType)lVar39;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_550,_tessLevelsStr,HStack_1b0.m_internal);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pWStack_550,"\n",1)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_550,"  - case B: program ",0x14);
                  std::ostream::operator<<((ostream *)&pWStack_550,iVar25);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_550,", tessellation levels: ",0x17);
                  getTessellationLevelsString_abi_cxx11_
                            (&local_678,(tessellation *)local_560,
                             (TessLevels *)(ulong)(this->m_caseDef).primitiveType,TVar22);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&pWStack_550,local_678._M_dataplus._M_p,
                             local_678._M_string_length);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&primitiveCount,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_678._M_dataplus._M_p != &local_678.field_2) {
                    operator_delete(local_678._M_dataplus._M_p,
                                    local_678.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_tessLevelsStr != local_1a8) {
                    operator_delete(_tessLevelsStr,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pWStack_550);
                  std::ios_base::~ios_base(local_4e0);
                  _primitiveCount = (deUint64)&local_548;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&primitiveCount,"Invalid set of primitives","");
                  __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
                  (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_5c8;
                  std::__cxx11::string::_M_construct<char*>
                            (psStack_5c0,_primitiveCount,
                             (long)&(pWStack_550->imageInfos).
                                    super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start + _primitiveCount);
                  goto LAB_00774d4e;
                }
              }
              if (prim0.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(prim0.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)prim0.
                                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)prim0.
                                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (pPVar2 != (pointer)0x0) {
                operator_delete(pPVar2,(long)primitives.
                                             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                       (long)pPVar2);
              }
              if (obj._M_p != (pointer)0x0) {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                          (&DStack_5e0,(VkPipeline)obj._M_p);
              }
              iVar25 = iVar25 + 1;
              pWVar36 = pWVar36 + 1;
            } while (pWVar36 !=
                     windingCases.
                     super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
            iVar25 = 0;
            bVar40 = true;
          }
LAB_00774dd1:
          if (windingCases.
              super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(windingCases.
                            super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)windingCases.
                                  super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)windingCases.
                                  super__Vector_base<vkt::tessellation::Winding,_std::allocator<vkt::tessellation::Winding>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar40) goto LAB_00774e22;
          lVar39 = local_5b8 + 1;
          pTVar31 = (pLVar35->levels).
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (lVar39 < (int)((ulong)((long)(pLVar35->levels).
                                              super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pTVar31) >> 3) * -0x55555555);
      }
      iVar25 = 0xe;
LAB_00774e22:
      if (firstPrim.
          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(firstPrim.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)firstPrim.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)firstPrim.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((iVar25 != 0xe) && (iVar25 != 0)) goto LAB_00774efe;
      local_610 = local_610 + 1;
    } while (local_610 <
             (int)((ulong)((long)tessLevelCases.
                                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)tessLevelCases.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5));
  }
  _primitiveCount = (deUint64)&local_548;
  std::__cxx11::string::_M_construct<char_const*>((string *)&primitiveCount,"OK","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,_primitiveCount,
             (long)&(pWStack_550->imageInfos).
                    super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start + _primitiveCount);
  if ((pointer)_primitiveCount != (pointer)&local_548) {
    operator_delete((void *)_primitiveCount,
                    (ulong)((long)&(local_548->imageInfos).
                                   super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
LAB_00774efe:
  if ((pointer)commandBuffer.m_internal != (pointer)0x0) {
    _primitiveCount = commandBuffer.m_internal;
    (*(code *)(local_578->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x18].sampler.m_internal)
              (local_578,local_570,local_568,1);
  }
  if (local_278.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_270,local_278);
  }
  if (local_308.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_300,local_308);
  }
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_250,local_258);
  }
  if (renderPass.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()(&DStack_370,renderPass);
  }
  if (local_598 != (pointer)0x0) {
    _primitiveCount = (deUint64)local_598;
    (*(code *)(pWStack_590->imageInfos).
              super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[0x14].imageView.m_internal)
              (pWStack_590,local_588,pVStack_580,1);
  }
  if (local_238.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_230,local_238);
  }
  if (local_2e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_2e0,local_2e8);
  }
  if (local_338.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_338.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_338.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_338.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_338.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_338.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_2a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_2a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_2a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_2a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_2a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_2a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&primitiveCounts);
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  ::~vector(&tessLevelCases);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus InvarianceTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(),
					FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	const std::vector<LevelCase>	tessLevelCases				= genTessLevelCases();
	const int						numPatchesPerDrawCall		= 2;
	int								maxNumPrimitivesPerPatch	= 0;  // computed below
	std::vector<std::vector<int> >	primitiveCounts;

	for (int caseNdx = 0; caseNdx < static_cast<int>(tessLevelCases.size()); ++caseNdx)
	{
		primitiveCounts.push_back(std::vector<int>());
		for (int levelNdx = 0; levelNdx < static_cast<int>(tessLevelCases[caseNdx].levels.size()); ++levelNdx)
		{
			const int primitiveCount = referencePrimitiveCount(m_caseDef.primitiveType, m_caseDef.spacingMode, m_caseDef.usePointMode,
															   &tessLevelCases[caseNdx].levels[levelNdx].inner[0], &tessLevelCases[caseNdx].levels[levelNdx].outer[0]);
			primitiveCounts.back().push_back(primitiveCount);
			maxNumPrimitivesPerPatch = de::max(maxNumPrimitivesPerPatch, primitiveCount);
		}
	}

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat     vertexFormat        = VK_FORMAT_R32_SFLOAT;
	const deUint32     vertexStride        = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes = NUM_TESS_LEVELS * numPatchesPerDrawCall * vertexStride;
	const Buffer       vertexBuffer        (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Output buffer: number of primitives and an array of PerPrimitive structures

	const int		   resultBufferMaxVertices		= numPatchesPerDrawCall * maxNumPrimitivesPerPatch * numVerticesPerPrimitive(m_caseDef.primitiveType, m_caseDef.usePointMode);
	const int		   resultBufferTessCoordsOffset = (int)sizeof(deInt32) * 4;
	const VkDeviceSize resultBufferSizeBytes        = resultBufferTessCoordsOffset + resultBufferMaxVertices * sizeof(PerPrimitive);
	const Buffer       resultBuffer                 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_GEOMETRY_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	const Unique<VkRenderPass>     renderPass    (makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>    framebuffer   (makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout               (vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool       (makeCommandPool                  (vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer     (allocateCommandBuffer            (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < static_cast<int>(tessLevelCases.size()); ++tessLevelCaseNdx)
	{
		const LevelCase& levelCase = tessLevelCases[tessLevelCaseNdx];
		PerPrimitiveVec  firstPrim;

		{
			tcu::TestLog& log = m_context.getTestContext().getLog();
			std::ostringstream tessLevelsStr;

			for (int i = 0; i < static_cast<int>(levelCase.levels.size()); ++i)
				tessLevelsStr << (levelCase.levels.size() > 1u ? "\n" : "") << getTessellationLevelsString(levelCase.levels[i], m_caseDef.primitiveType);

			log << tcu::TestLog::Message << "Tessellation level sets: " << tessLevelsStr.str() << tcu::TestLog::EndMessage;
		}

		for (int subTessLevelCaseNdx = 0; subTessLevelCaseNdx < static_cast<int>(levelCase.levels.size()); ++subTessLevelCaseNdx)
		{
			const TessLevels& tessLevels = levelCase.levels[subTessLevelCaseNdx];
			{
				TessLevels data[2];
				data[0] = tessLevels;
				data[1] = tessLevels;

				const Allocation& alloc = vertexBuffer.getAllocation();
				deMemcpy(alloc.getHostPtr(), data, sizeof(data));
				flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(data));
			}

			int programNdx = 0;
			const std::vector<Winding> windingCases = getWindingCases(m_caseDef.windingUsage);
			for (std::vector<Winding>::const_iterator windingIter = windingCases.begin(); windingIter != windingCases.end(); ++windingIter)
			{
				const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
					.setPatchControlPoints        (NUM_TESS_LEVELS)
					.setVertexInputSingleAttribute(vertexFormat, vertexStride)
					.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get(getProgramName("tese", *windingIter, m_caseDef.usePointMode)), DE_NULL)
					.setShader                    (vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,                m_context.getBinaryCollection().get(getProgramName("geom", m_caseDef.usePointMode)), DE_NULL)
					.build                        (vk, device, *pipelineLayout, *renderPass));

				{
					const Allocation& alloc = resultBuffer.getAllocation();
					deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
					flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
				}

				beginCommandBuffer(vk, *cmdBuffer);
				beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

				vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
				vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
				{
					const VkDeviceSize vertexBufferOffset = 0ull;
					vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
				}

				vk.cmdDraw(*cmdBuffer, numPatchesPerDrawCall * NUM_TESS_LEVELS, 1u, 0u, 0u);
				endRenderPass(vk, *cmdBuffer);

				{
					const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
						VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

					vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
						0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
				}

				endCommandBuffer(vk, *cmdBuffer);
				submitCommandsAndWait(vk, device, queue, *cmdBuffer);

				// Verify case result
				{
					const Allocation& resultAlloc = resultBuffer.getAllocation();
					invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

					const int				refNumPrimitives     = numPatchesPerDrawCall * primitiveCounts[tessLevelCaseNdx][subTessLevelCaseNdx];
					const int				numPrimitiveVertices = numVerticesPerPrimitive(m_caseDef.primitiveType, m_caseDef.usePointMode);
					const deInt32			numPrimitives        = *static_cast<deInt32*>(resultAlloc.getHostPtr());
					const PerPrimitiveVec	primitives           = sorted(readInterleavedData<PerPrimitive>(numPrimitives, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(PerPrimitive)),
																		  byPatchPrimitiveID);

					// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
					DE_ASSERT(numPrimitiveVertices * numPrimitives <= resultBufferMaxVertices);
					DE_UNREF(numPrimitiveVertices);

					tcu::TestLog& log = m_context.getTestContext().getLog();

					if (numPrimitives != refNumPrimitives)
					{
						log << tcu::TestLog::Message << "Failure: got " << numPrimitives << " primitives, but expected " << refNumPrimitives << tcu::TestLog::EndMessage;

						return tcu::TestStatus::fail("Invalid set of primitives");
					}

					const int					half  = static_cast<int>(primitives.size() / 2);
					const PerPrimitiveVec		prim0 = PerPrimitiveVec(primitives.begin(), primitives.begin() + half);
					const PerPrimitive* const	prim1 = &primitives[half];

					if (!comparePrimitivesExact(&prim0[0], prim1, half))
					{
							log << tcu::TestLog::Message << "Failure: tessellation coordinates differ between two primitives drawn in one draw call" << tcu::TestLog::EndMessage
								<< tcu::TestLog::Message << "Note: tessellation levels for both primitives were: " << getTessellationLevelsString(tessLevels, m_caseDef.primitiveType) << tcu::TestLog::EndMessage;

							return tcu::TestStatus::fail("Invalid set of primitives");
					}

					if (programNdx == 0 && subTessLevelCaseNdx == 0)
						firstPrim = prim0;
					else
					{
						const bool compareOk = compare(firstPrim, prim0, levelCase.mem);
						if (!compareOk)
						{
							log << tcu::TestLog::Message
								<< "Note: comparison of tessellation coordinates failed; comparison was made between following cases:\n"
								<< "  - case A: program 0, tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx].levels[0], m_caseDef.primitiveType) << "\n"
								<< "  - case B: program " << programNdx << ", tessellation levels: " << getTessellationLevelsString(tessLevels, m_caseDef.primitiveType)
								<< tcu::TestLog::EndMessage;

							return tcu::TestStatus::fail("Invalid set of primitives");
						}
					}
				}
				++programNdx;
			}
		}
	}
	return tcu::TestStatus::pass("OK");
}